

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O2

void __thiscall
toml::detail::location<std::vector<char,_std::allocator<char>_>_>::location
          (location<std::vector<char,_std::allocator<char>_>_> *this,
          location<std::vector<char,_std::allocator<char>_>_> *param_1)

{
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_0014da00;
  std::__shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->source_).
                super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ,&(param_1->source_).
                 super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              );
  this->line_number_ = param_1->line_number_;
  std::__cxx11::string::string((string *)&this->source_name_,(string *)&param_1->source_name_);
  (this->iter_)._M_current = (param_1->iter_)._M_current;
  return;
}

Assistant:

location(const location&) = default;